

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

bool mightBeRichTextImpl<QStringView>(QStringView text)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QStringView element;
  bool bVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  storage_type_conflict *psVar5;
  char16_t *str;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype close;
  qsizetype open;
  qsizetype start;
  QChar current;
  QVarLengthArray<char16_t,_256LL> tag;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  QVarLengthArray<char16_t,_256LL> *in_stack_fffffffffffffc80;
  QStringView *in_stack_fffffffffffffc88;
  undefined5 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc95;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  QStringView *in_stack_fffffffffffffc98;
  undefined6 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffca7;
  char *in_stack_fffffffffffffca8;
  storage_type_conflict *pos;
  bool local_349;
  storage_type_conflict *in_stack_fffffffffffffcb8;
  QChar c;
  bool local_339;
  bool local_329;
  bool local_315;
  storage_type_conflict *local_310;
  storage_type_conflict *local_300;
  storage_type_conflict *local_2d8;
  bool local_2c9;
  undefined1 local_2b8 [20];
  QChar local_2a4;
  QChar local_2a2;
  char16_t local_2a0;
  QChar local_29e;
  QChar local_29c;
  char16_t local_29a;
  QLatin1StringView local_298;
  QStringView local_288;
  QChar local_274;
  char16_t local_272;
  QChar local_270;
  char16_t local_26e;
  QChar local_26c;
  char16_t local_26a;
  QStringView local_268;
  char16_t local_252;
  QChar local_250;
  char16_t local_24e;
  QChar local_24c;
  char16_t local_24a;
  QStringView local_248;
  char16_t local_232;
  QStringView local_230;
  QVarLengthArray<char16_t,_256LL> local_220;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QStringView::isEmpty((QStringView *)0x7bc735);
  if (bVar1) {
    local_2c9 = false;
  }
  else {
    local_2d8 = (storage_type_conflict *)0x0;
    while( true ) {
      qVar4 = QStringView::size(&local_230);
      local_315 = false;
      if ((long)local_2d8 < qVar4) {
        local_232 = (char16_t)
                    QStringView::at((QStringView *)
                                    CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                                    0x7bc796);
        local_315 = QChar::isSpace((QChar *)0x7bc7ab);
      }
      if (local_315 == false) break;
      local_2d8 = (storage_type_conflict *)((long)local_2d8 + 1);
    }
    local_248 = QStringView::mid(in_stack_fffffffffffffc98,(qsizetype)in_stack_fffffffffffffca8,
                                 CONCAT17(in_stack_fffffffffffffca7,
                                          CONCAT16(in_stack_fffffffffffffca6,
                                                   in_stack_fffffffffffffca0)));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80);
    s.m_size._6_1_ = in_stack_fffffffffffffca6;
    s.m_size._0_6_ = in_stack_fffffffffffffca0;
    s.m_size._7_1_ = in_stack_fffffffffffffca7;
    s.m_data = in_stack_fffffffffffffca8;
    iVar3 = QStringView::compare
                      ((QStringView *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                       s,CaseInsensitive);
    if (iVar3 == 0) {
      for (; qVar4 = QStringView::size(&local_230), (long)local_2d8 < qVar4;
          local_2d8 = (storage_type_conflict *)((long)local_2d8 + 1)) {
        local_24a = (char16_t)
                    QStringView::at((QStringView *)
                                    CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                                    0x7bc887);
        QChar::QChar<char16_t,_true>(&local_24c,L'?');
        bVar1 = operator==((QChar *)in_stack_fffffffffffffc80,
                           (QChar *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
        local_329 = false;
        if (bVar1) {
          qVar4 = QStringView::size(&local_230);
          local_329 = false;
          if ((long)(local_2d8 + 1) < qVar4) {
            local_24e = (char16_t)
                        QStringView::at((QStringView *)
                                        CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78
                                                ),0x7bc90f);
            QChar::QChar<char16_t,_true>(&local_250,L'>');
            local_329 = operator==((QChar *)in_stack_fffffffffffffc80,
                                   (QChar *)CONCAT17(in_stack_fffffffffffffc7f,
                                                     in_stack_fffffffffffffc78));
          }
        }
        if (local_329 != false) {
          local_2d8 = local_2d8 + 1;
          break;
        }
      }
      while( true ) {
        in_stack_fffffffffffffcb8 = local_2d8;
        qVar4 = QStringView::size(&local_230);
        local_339 = false;
        if ((long)in_stack_fffffffffffffcb8 < qVar4) {
          local_252 = (char16_t)
                      QStringView::at((QStringView *)
                                      CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                                      0x7bc9bf);
          local_339 = QChar::isSpace((QChar *)0x7bc9d4);
        }
        if (local_339 == false) break;
        local_2d8 = (storage_type_conflict *)((long)local_2d8 + 1);
      }
    }
    local_268 = QStringView::mid(in_stack_fffffffffffffc98,(qsizetype)in_stack_fffffffffffffca8,
                                 CONCAT17(in_stack_fffffffffffffca7,
                                          CONCAT16(in_stack_fffffffffffffca6,
                                                   in_stack_fffffffffffffca0)));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80);
    s_00.m_size._6_1_ = in_stack_fffffffffffffca6;
    s_00.m_size._0_6_ = in_stack_fffffffffffffca0;
    s_00.m_size._7_1_ = in_stack_fffffffffffffca7;
    s_00.m_data = in_stack_fffffffffffffca8;
    iVar3 = QStringView::compare
                      ((QStringView *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                       s_00,CaseInsensitive);
    if (iVar3 == 0) {
      local_2c9 = true;
    }
    else {
      local_300 = local_2d8;
      while( true ) {
        pos = local_300;
        qVar4 = QStringView::size(&local_230);
        local_349 = false;
        if ((long)pos < qVar4) {
          local_26a = (char16_t)
                      QStringView::at((QStringView *)
                                      CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                                      0x7bcacc);
          QChar::QChar<char16_t,_true>(&local_26c,L'<');
          bVar1 = operator!=((QChar *)in_stack_fffffffffffffc80,
                             (QChar *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78))
          ;
          local_349 = false;
          if (bVar1) {
            local_26e = (char16_t)
                        QStringView::at((QStringView *)
                                        CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78
                                                ),0x7bcb1f);
            QChar::QChar<char16_t,_true>(&local_270,L'\n');
            local_349 = operator!=((QChar *)in_stack_fffffffffffffc80,
                                   (QChar *)CONCAT17(in_stack_fffffffffffffc7f,
                                                     in_stack_fffffffffffffc78));
          }
        }
        c.ucs = (char16_t)((ulong)in_stack_fffffffffffffcb8 >> 0x30);
        if (local_349 == false) {
          psVar5 = local_300;
          qVar4 = QStringView::size(&local_230);
          uVar6 = false;
          if ((long)psVar5 < qVar4) {
            local_29a = (char16_t)
                        QStringView::at((QStringView *)
                                        CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78
                                                ),0x7bcc8c);
            QChar::QChar<char16_t,_true>(&local_29c,L'<');
            uVar6 = operator==((QChar *)in_stack_fffffffffffffc80,
                               (QChar *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78
                                                ));
          }
          if ((bool)uVar6 != false) {
            QChar::QChar<char16_t,_true>(&local_29e,L'>');
            psVar5 = (storage_type_conflict *)
                     QStringView::indexOf
                               ((QStringView *)
                                CONCAT17(in_stack_fffffffffffffc97,
                                         CONCAT16(in_stack_fffffffffffffc96,
                                                  CONCAT15(in_stack_fffffffffffffc95,
                                                           in_stack_fffffffffffffc90))),c,
                                (qsizetype)in_stack_fffffffffffffc88,
                                (CaseSensitivity)((ulong)in_stack_fffffffffffffc80 >> 0x20));
            if (-1 < (long)psVar5) {
              memset(&local_220,0xaa,0x218);
              QVarLengthArray<char16_t,_256LL>::QVarLengthArray(&local_220);
              goto LAB_007bcd4c;
            }
          }
          local_2c9 = false;
          goto LAB_007bcfc9;
        }
        local_272 = (char16_t)
                    QStringView::at((QStringView *)
                                    CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                                    0x7bcb74);
        QChar::QChar<char16_t,_true>(&local_274,L'&');
        bVar1 = operator==((QChar *)in_stack_fffffffffffffc80,
                           (QChar *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
        bVar2 = false;
        if (bVar1) {
          local_288 = QStringView::mid(in_stack_fffffffffffffc98,(qsizetype)pos,
                                       (ulong)CONCAT16(in_stack_fffffffffffffca6,
                                                       in_stack_fffffffffffffca0));
          local_298 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80
                                );
          bVar2 = operator==((QStringView *)in_stack_fffffffffffffc80,
                             (QLatin1StringView *)
                             CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
        }
        if (bVar2 != false) break;
        local_300 = (storage_type_conflict *)((long)local_300 + 1);
        in_stack_fffffffffffffca7 = 0;
      }
      local_2c9 = true;
    }
  }
  goto LAB_007bcfc9;
LAB_007bcd4c:
  local_310 = (storage_type_conflict *)((long)local_300 + 1);
  if ((long)local_310 < (long)psVar5) {
    local_2a0._0_1_ = -0x56;
    local_2a0._1_1_ = -0x56;
    local_2a0 = (char16_t)
                QStringView::operator[]
                          (in_stack_fffffffffffffc88,(qsizetype)in_stack_fffffffffffffc80);
    bVar1 = QChar::isDigit((QChar *)0x7bcd95);
    if ((bVar1) || (bVar1 = QChar::isLetter((QChar *)0x7bcda6), bVar1)) {
      local_2a2 = QChar::toLower((QChar *)in_stack_fffffffffffffc80);
      QChar::unicode(&local_2a2);
      QVarLengthArray<char16_t,_256LL>::append
                ((QVarLengthArray<char16_t,_256LL> *)
                 CONCAT17(in_stack_fffffffffffffc97,
                          CONCAT16(in_stack_fffffffffffffc96,
                                   CONCAT15(in_stack_fffffffffffffc95,in_stack_fffffffffffffc90))),
                 (char16_t *)in_stack_fffffffffffffc88);
      local_300 = local_310;
    }
    else {
      bVar1 = QVarLengthArray<char16_t,_256LL>::isEmpty
                        ((QVarLengthArray<char16_t,_256LL> *)0x7bcdf0);
      if ((!bVar1) && (bVar1 = QChar::isSpace((QChar *)0x7bce01), bVar1)) goto LAB_007bcf26;
      bVar1 = QVarLengthArray<char16_t,_256LL>::isEmpty
                        ((QVarLengthArray<char16_t,_256LL> *)0x7bce19);
      in_stack_fffffffffffffc97 = false;
      if (!bVar1) {
        QChar::QChar<char16_t,_true>(&local_2a4,L'/');
        bVar1 = operator==((QChar *)in_stack_fffffffffffffc80,
                           (QChar *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
        in_stack_fffffffffffffc97 = false;
        if (bVar1) {
          in_stack_fffffffffffffc97 = local_300 + 1 == psVar5;
        }
      }
      if ((bool)in_stack_fffffffffffffc97 != false) goto LAB_007bcf26;
      bVar2 = QChar::isSpace((QChar *)0x7bce90);
      bVar1 = false;
      if (!bVar2) {
        bVar2 = QVarLengthArray<char16_t,_256LL>::isEmpty
                          ((QVarLengthArray<char16_t,_256LL> *)0x7bceaa);
        in_stack_fffffffffffffc95 = true;
        bVar1 = (bool)in_stack_fffffffffffffc95;
        if (bVar2) {
          QChar::QChar<char16_t,_true>((QChar *)(local_2b8 + 0x12),L'!');
          in_stack_fffffffffffffc95 =
               operator!=((QChar *)in_stack_fffffffffffffc80,
                          (QChar *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
          bVar1 = (bool)in_stack_fffffffffffffc95;
        }
      }
      if (bVar1 != false) {
        local_2c9 = false;
        goto LAB_007bcfb0;
      }
      in_stack_fffffffffffffc96 = 0;
      local_300 = local_310;
    }
    goto LAB_007bcd4c;
  }
LAB_007bcf26:
  in_stack_fffffffffffffc80 = (QVarLengthArray<char16_t,_256LL> *)local_2b8;
  str = std::data<QVarLengthArray<char16_t,256ll>>((QVarLengthArray<char16_t,_256LL> *)0x7bcf60);
  QtPrivate::lengthHelperContainer<QVarLengthArray<char16_t,256ll>>
            ((QVarLengthArray<char16_t,_256LL> *)0x7bcf72);
  QStringView::QStringView<char16_t,_true>
            ((QStringView *)
             CONCAT17(in_stack_fffffffffffffc97,
                      CONCAT16(in_stack_fffffffffffffc96,
                               CONCAT15(in_stack_fffffffffffffc95,in_stack_fffffffffffffc90))),str,
             (qsizetype)in_stack_fffffffffffffc80);
  element.m_size._6_1_ = uVar6;
  element.m_size._0_6_ = in_stack_fffffffffffffca0;
  element.m_size._7_1_ = in_stack_fffffffffffffca7;
  element.m_data = pos;
  iVar3 = QTextHtmlParser::lookupElement(element);
  local_2c9 = iVar3 != -1;
LAB_007bcfb0:
  QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(in_stack_fffffffffffffc80);
LAB_007bcfc9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2c9;
}

Assistant:

static bool mightBeRichTextImpl(T text)
{
    if (text.isEmpty())
        return false;
    qsizetype start = 0;

    while (start < text.size() && QChar(text.at(start)).isSpace())
        ++start;

    // skip a leading <?xml ... ?> as for example with xhtml
    if (text.mid(start, 5).compare("<?xml"_L1) == 0) {
        while (start < text.size()) {
            if (text.at(start) == u'?'
                && start + 2 < text.size()
                && text.at(start + 1) == u'>') {
                start += 2;
                break;
            }
            ++start;
        }

        while (start < text.size() && QChar(text.at(start)).isSpace())
            ++start;
    }

    if (text.mid(start, 5).compare("<!doc"_L1, Qt::CaseInsensitive) == 0)
        return true;
    qsizetype open = start;
    while (open < text.size() && text.at(open) != u'<'
            && text.at(open) != u'\n') {
        if (text.at(open) == u'&' && text.mid(open + 1, 3) == "lt;"_L1)
            return true; // support desperate attempt of user to see <...>
        ++open;
    }
    if (open < text.size() && text.at(open) == u'<') {
        const qsizetype close = text.indexOf(u'>', open);
        if (close > -1) {
            QVarLengthArray<char16_t> tag;
            for (qsizetype i = open + 1; i < close; ++i) {
                const auto current = QChar(text[i]);
                if (current.isDigit() || current.isLetter())
                    tag.append(current.toLower().unicode());
                else if (!tag.isEmpty() && current.isSpace())
                    break;
                else if (!tag.isEmpty() && current == u'/' && i + 1 == close)
                    break;
                else if (!current.isSpace() && (!tag.isEmpty() || current != u'!'))
                    return false; // that's not a tag
            }
#ifndef QT_NO_TEXTHTMLPARSER
            return QTextHtmlParser::lookupElement(tag) != -1;
#else
            return false;
#endif // QT_NO_TEXTHTMLPARSER
        }
    }
    return false;
}